

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O2

void MOJOSHADER_glSetVertexShaderUniformF(uint idx,float *data,uint vec4n)

{
  MOJOSHADER_glContext *pMVar1;
  uint uVar2;
  
  pMVar1 = ctx;
  if (idx < 0x2000) {
    uVar2 = 0x2000 - idx;
    if (vec4n <= 0x2000 - idx) {
      uVar2 = vec4n;
    }
    memcpy(ctx->vs_reg_file_f + (idx << 2),data,(ulong)(uVar2 << 4));
    pMVar1->generation = pMVar1->generation + 1;
  }
  return;
}

Assistant:

void MOJOSHADER_glSetVertexShaderUniformF(unsigned int idx, const float *data,
                                          unsigned int vec4n)
{
    const uint maxregs = STATICARRAYLEN(ctx->vs_reg_file_f) / 4;
    if (idx < maxregs)
    {
        assert(sizeof (GLfloat) == sizeof (float));
        const uint cpy = (minuint(maxregs - idx, vec4n) * sizeof (*data)) * 4;
        memcpy(ctx->vs_reg_file_f + (idx * 4), data, cpy);
        ctx->generation++;
    } // if
}